

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

int Abc_NodeMakeSCCFree(Abc_Obj_t *pNode)

{
  size_t __n;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *__src;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  int v;
  ulong uVar8;
  char *pcVar9;
  undefined1 *__dest;
  
  uVar1 = (pNode->vFanins).nSize;
  iVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  __src = (char *)(pNode->field_5).pData;
  __n = (long)(int)uVar1 + 3;
  pcVar4 = __src;
  do {
    if (*pcVar4 == '\0') {
      if (iVar2 == 0) {
        return 0;
      }
      __dest = (undefined1 *)(pNode->field_5).pData;
      do {
        if (*__src != 'z') {
          if (*__src == '\0') {
            *__dest = 0;
            return 1;
          }
          memcpy(__dest,__src,__n);
          __dest = __dest + __n;
        }
        __src = __src + __n;
      } while( true );
    }
    for (pcVar5 = pcVar4 + (long)(int)uVar1 + 3; *pcVar5 != '\0'; pcVar5 = pcVar5 + __n) {
      if ((*pcVar5 != 'z') && (*pcVar4 != 'z')) {
        uVar6 = 1;
        for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
          if (pcVar4[uVar8] != pcVar5[uVar8]) {
            uVar6 = 0;
            uVar7 = 0;
            if ((pcVar4[uVar8] == '-') || (pcVar5[uVar8] != '-')) goto LAB_001c1f87;
          }
        }
        uVar7 = uVar6 | 2;
LAB_001c1f87:
        iVar2 = (iVar2 + 1) - (uint)(uVar7 == 0);
        pcVar9 = pcVar5;
        if (((uVar7 & 1) != 0) || (pcVar9 = pcVar4, uVar7 != 0)) {
          *pcVar9 = 'z';
        }
      }
    }
    pcVar4 = pcVar4 + __n;
  } while( true );
}

Assistant:

int Abc_NodeMakeSCCFree( Abc_Obj_t * pNode )
{
    char * pSop = (char *)pNode->pData;
    char * pCube, * pCube2, * pSopNew;
    int nVars = Abc_ObjFaninNum(pNode);
    int Status, nCount = 0;
    Abc_SopForEachCubePair( pSop, nVars, pCube, pCube2 )
    {
        if ( pCube[0] == 'z' || pCube2[0] == 'z' )
            continue;
        Status = Abc_CubeContain( pCube, pCube2, nVars );
        nCount += (int)(Status > 0);
        if ( Status & 1 )
            pCube2[0] = 'z';
        else if ( Status & 2 )
            pCube[0] = 'z';
    }
    if ( nCount == 0 )
        return 0;
    // create new cover
    pSopNew = (char *)pNode->pData;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        if ( pCube[0] == 'z' )
            continue;
        memcpy( pSopNew, pCube, nVars + 3 );
        pSopNew += nVars + 3;
    }
    *pSopNew = 0;
    return 1;
}